

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

deUint32 deqp::gles31::Functional::getUlpDiffIgnoreZeroSign(float a,float b)

{
  deUint32 dVar1;
  deUint32 aBits;
  float fVar2;
  
  if (((a != 0.0) || (fVar2 = b, NAN(a))) && ((b != 0.0 || (fVar2 = a, NAN(b))))) {
    dVar1 = (int)b - (int)a;
    if ((uint)b < (uint)a) {
      dVar1 = -((int)b - (int)a);
    }
    return dVar1;
  }
  return (deUint32)ABS(fVar2);
}

Assistant:

inline deUint32 getUlpDiffIgnoreZeroSign (float a, float b)
{
	if (tcu::Float32(a).isZero())
		return getUlpDiff(tcu::Float32::construct(tcu::Float32(b).sign(), 0, 0).asFloat(), b);
	else if (tcu::Float32(b).isZero())
		return getUlpDiff(a, tcu::Float32::construct(tcu::Float32(a).sign(), 0, 0).asFloat());
	else
		return getUlpDiff(a, b);
}